

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skin.cpp
# Opt level: O2

Stream * rw::readSkin(Stream *stream,int32 len,void *object,int32 offset,int32 param_5)

{
  int iVar1;
  Stream *pSVar2;
  Skin *this;
  long lVar3;
  int32 i;
  long lVar4;
  uint8 header [4];
  
  if (*(int **)((long)object + 0x98) == (int *)0x0) {
    (*stream->_vptr_Stream[4])(stream,header,4);
    allocLocation =
         "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/skin.cpp line: 137"
    ;
    this = (Skin *)(*DAT_00145dd8)(0x70,0x30116);
    *(Skin **)((long)object + (long)offset) = this;
    if (header[1] == '\0') {
      Skin::init(this,(EVP_PKEY_CTX *)(ulong)header[0]);
      this->numWeights = (uint)header[2];
    }
    else {
      Skin::init(this,(EVP_PKEY_CTX *)(ulong)header[0]);
      this->numWeights = (uint)header[2];
      (*stream->_vptr_Stream[4])(stream,this->usedBones,(ulong)(uint)this->numUsedBones);
    }
    if (this->indices != (uint8 *)0x0) {
      (*stream->_vptr_Stream[4])
                (stream,this->indices,(ulong)(uint)(*(int *)((long)object + 0x1c) << 2));
    }
    if (this->weights != (float *)0x0) {
      Stream::read32(stream,this->weights,*(int *)((long)object + 0x1c) << 4);
    }
    lVar3 = 0;
    for (lVar4 = 0; lVar4 < this->numBones; lVar4 = lVar4 + 1) {
      if (header[1] == '\0') {
        (*stream->_vptr_Stream[5])(stream,4,1);
      }
      Stream::read32(stream,(void *)((long)this->inverseMatrices + lVar3),0x40);
      lVar3 = lVar3 + 0x40;
    }
    if (header[1] == '\0') {
      Skin::findNumWeights(this,*(int32 *)((long)object + 0x1c));
      Skin::findUsedBones(this,*(int32 *)((long)object + 0x1c));
    }
    else {
      readSkinSplitData(stream,this);
    }
  }
  else {
    iVar1 = **(int **)((long)object + 0x98);
    if (iVar1 == 0xb) {
      pSVar2 = wdgl::readNativeSkin(stream,len,object,offset);
      return pSVar2;
    }
    if (iVar1 == 5) {
      pSVar2 = xbox::readNativeSkin(stream,len,object,offset);
      return pSVar2;
    }
    if (iVar1 == 4) {
      pSVar2 = ps2::readNativeSkin(stream,len,object,offset);
      return pSVar2;
    }
    stream = (Stream *)0x0;
  }
  return stream;
}

Assistant:

static Stream*
readSkin(Stream *stream, int32 len, void *object, int32 offset, int32)
{
	uint8 header[4];
	Geometry *geometry = (Geometry*)object;

	if(geometry->instData){
		// TODO: function pointers
		if(geometry->instData->platform == PLATFORM_PS2)
			return ps2::readNativeSkin(stream, len, object, offset);
		else if(geometry->instData->platform == PLATFORM_WDGL)
			return wdgl::readNativeSkin(stream, len, object, offset);
		else if(geometry->instData->platform == PLATFORM_XBOX)
			return xbox::readNativeSkin(stream, len, object, offset);
		else{
			assert(0 && "unsupported native skin platform");
			return nil;
		}
	}

	stream->read8(header, 4);  // numBones, numUsedBones,
	                          // numWeights, unused
	Skin *skin = rwNewT(Skin, 1, MEMDUR_EVENT | ID_SKIN);
	*PLUGINOFFSET(Skin*, geometry, offset) = skin;

	// numUsedBones and numWeights appear in/after 34003
	// but not in/before 33002 (probably rw::version >= 0x34000)
	bool oldFormat = header[1] == 0;

	// Use numBones for numUsedBones to allocate data,
	// find out the correct value later
	if(oldFormat)
		skin->init(header[0], header[0], geometry->numVertices);
	else
		skin->init(header[0], header[1], geometry->numVertices);
	skin->numWeights = header[2];

	if(!oldFormat)
		stream->read8(skin->usedBones, skin->numUsedBones);
	if(skin->indices)
		stream->read8(skin->indices, geometry->numVertices*4);
	if(skin->weights)
		stream->read32(skin->weights, geometry->numVertices*16);
	for(int32 i = 0; i < skin->numBones; i++){
		if(oldFormat)
			stream->seek(4);	// skip 0xdeaddead
		stream->read32(&skin->inverseMatrices[i*16], 64);
	}

	if(oldFormat){
		skin->findNumWeights(geometry->numVertices);
		skin->findUsedBones(geometry->numVertices);
	}

	if(!oldFormat)
		readSkinSplitData(stream, skin);

	return stream;
}